

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O0

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2
          (ReflectionTester *this,Message *message)

{
  undefined8 uVar1;
  bool bVar2;
  FieldDescriptor *pFVar3;
  char *pcVar4;
  string *psVar5;
  Reflection *pRVar6;
  char *in_R9;
  AssertHelper local_1b70;
  Message local_1b68;
  allocator<char> local_1b59;
  string local_1b58;
  undefined1 local_1b38 [8];
  AssertionResult gtest_ar_80;
  Message local_1b20;
  allocator<char> local_1b11;
  string local_1b10;
  string local_1af0;
  undefined1 local_1ad0 [8];
  AssertionResult gtest_ar_79;
  Message local_1ab8;
  allocator<char> local_1aa9;
  string local_1aa8;
  undefined1 local_1a88 [8];
  AssertionResult gtest_ar_78;
  Message local_1a70;
  allocator<char> local_1a61;
  string local_1a60;
  string local_1a40;
  undefined1 local_1a20 [8];
  AssertionResult gtest_ar_77;
  Message local_1a08;
  allocator<char> local_19f9;
  string local_19f8;
  EnumValueDescriptor *local_19d8;
  undefined1 local_19d0 [8];
  AssertionResult gtest_ar_76;
  Message local_19b8;
  allocator<char> local_19a9;
  string local_19a8;
  EnumValueDescriptor *local_1988;
  undefined1 local_1980 [8];
  AssertionResult gtest_ar_75;
  Message local_1968;
  allocator<char> local_1959;
  string local_1958;
  EnumValueDescriptor *local_1938;
  undefined1 local_1930 [8];
  AssertionResult gtest_ar_74;
  Message local_1918;
  int32_t local_1910;
  int local_190c;
  undefined1 local_1908 [8];
  AssertionResult gtest_ar_73;
  string local_18f0;
  AssertHelper local_18d0;
  Message local_18c8;
  int32_t local_18c0;
  int local_18bc;
  undefined1 local_18b8 [8];
  AssertionResult gtest_ar_72;
  string local_18a0;
  AssertHelper local_1880;
  Message local_1878;
  int32_t local_1870;
  int local_186c;
  undefined1 local_1868 [8];
  AssertionResult gtest_ar_71;
  string local_1850;
  AssertHelper local_1830;
  Message local_1828;
  int32_t local_1820;
  int local_181c;
  undefined1 local_1818 [8];
  AssertionResult gtest_ar_70;
  string local_1800;
  AssertHelper local_17e0;
  Message local_17d8;
  int32_t local_17d0;
  int local_17cc;
  undefined1 local_17c8 [8];
  AssertionResult gtest_ar_69;
  string local_17b0;
  AssertHelper local_1790;
  Message local_1788;
  allocator<char> local_1779;
  string local_1778;
  undefined1 local_1758 [8];
  AssertionResult gtest_ar_68;
  Message local_1740;
  allocator<char> local_1731;
  string local_1730;
  undefined1 local_1710 [8];
  AssertionResult gtest_ar_67;
  Message local_16f8;
  allocator<char> local_16e9;
  string local_16e8;
  string local_16c8;
  undefined1 local_16a8 [8];
  AssertionResult gtest_ar_66;
  Message local_1690;
  allocator<char> local_1681;
  string local_1680;
  string local_1660;
  undefined1 local_1640 [8];
  AssertionResult gtest_ar_65;
  AssertHelper local_1610;
  Message local_1608;
  allocator<char> local_15f9;
  string local_15f8;
  bool local_15d1;
  undefined1 local_15d0 [8];
  AssertionResult gtest_ar__1;
  Message local_15b8;
  allocator<char> local_15a9;
  string local_15a8;
  double local_1588;
  int local_157c;
  undefined1 local_1578 [8];
  AssertionResult gtest_ar_64;
  Message local_1560;
  allocator<char> local_1551;
  string local_1550;
  float local_1530;
  int local_152c;
  undefined1 local_1528 [8];
  AssertionResult gtest_ar_63;
  Message local_1510;
  allocator<char> local_1501;
  string local_1500;
  int64_t local_14e0;
  int local_14d4;
  undefined1 local_14d0 [8];
  AssertionResult gtest_ar_62;
  Message local_14b8;
  allocator<char> local_14a9;
  string local_14a8;
  int32_t local_1488;
  int local_1484;
  undefined1 local_1480 [8];
  AssertionResult gtest_ar_61;
  Message local_1468;
  allocator<char> local_1459;
  string local_1458;
  uint64_t local_1438;
  int local_142c;
  undefined1 local_1428 [8];
  AssertionResult gtest_ar_60;
  Message local_1410;
  allocator<char> local_1401;
  string local_1400;
  uint32_t local_13e0 [2];
  undefined1 local_13d8 [8];
  AssertionResult gtest_ar_59;
  Message local_13c0;
  allocator<char> local_13b1;
  string local_13b0;
  int64_t local_1390;
  int local_1384;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar_58;
  Message local_1368;
  allocator<char> local_1359;
  string local_1358;
  int32_t local_1338;
  int local_1334;
  undefined1 local_1330 [8];
  AssertionResult gtest_ar_57;
  Message local_1318;
  allocator<char> local_1309;
  string local_1308;
  uint64_t local_12e8;
  int local_12dc;
  undefined1 local_12d8 [8];
  AssertionResult gtest_ar_56;
  Message local_12c0;
  allocator<char> local_12b1;
  string local_12b0;
  uint32_t local_1290 [2];
  undefined1 local_1288 [8];
  AssertionResult gtest_ar_55;
  Message local_1270;
  allocator<char> local_1261;
  string local_1260;
  int64_t local_1240;
  int local_1234;
  undefined1 local_1230 [8];
  AssertionResult gtest_ar_54;
  Message local_1218;
  allocator<char> local_1209;
  string local_1208;
  int32_t local_11e8;
  int local_11e4;
  undefined1 local_11e0 [8];
  AssertionResult gtest_ar_53;
  Message local_11c8;
  allocator<char> local_11b9;
  string local_11b8;
  undefined1 local_1198 [8];
  AssertionResult gtest_ar_52;
  Message local_1180;
  allocator<char> local_1171;
  string local_1170;
  string local_1150;
  undefined1 local_1130 [8];
  AssertionResult gtest_ar_51;
  Message local_1118;
  allocator<char> local_1109;
  string local_1108;
  undefined1 local_10e8 [8];
  AssertionResult gtest_ar_50;
  Message local_10d0;
  allocator<char> local_10c1;
  string local_10c0;
  string local_10a0;
  undefined1 local_1080 [8];
  AssertionResult gtest_ar_49;
  Message local_1068;
  allocator<char> local_1059;
  string local_1058;
  EnumValueDescriptor *local_1038;
  undefined1 local_1030 [8];
  AssertionResult gtest_ar_48;
  Message local_1018;
  allocator<char> local_1009;
  string local_1008;
  EnumValueDescriptor *local_fe8;
  undefined1 local_fe0 [8];
  AssertionResult gtest_ar_47;
  Message local_fc8;
  allocator<char> local_fb9;
  string local_fb8;
  EnumValueDescriptor *local_f98;
  undefined1 local_f90 [8];
  AssertionResult gtest_ar_46;
  Message local_f78;
  int32_t local_f70;
  int local_f6c;
  undefined1 local_f68 [8];
  AssertionResult gtest_ar_45;
  string local_f50;
  AssertHelper local_f30;
  Message local_f28;
  int32_t local_f20;
  int local_f1c;
  undefined1 local_f18 [8];
  AssertionResult gtest_ar_44;
  string local_f00;
  AssertHelper local_ee0;
  Message local_ed8;
  int32_t local_ed0;
  int local_ecc;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_43;
  string local_eb0;
  AssertHelper local_e90;
  Message local_e88;
  int32_t local_e80;
  int local_e7c;
  undefined1 local_e78 [8];
  AssertionResult gtest_ar_42;
  string local_e60;
  AssertHelper local_e40;
  Message local_e38;
  int32_t local_e30;
  int local_e2c;
  undefined1 local_e28 [8];
  AssertionResult gtest_ar_41;
  string local_e10;
  AssertHelper local_df0;
  Message local_de8;
  allocator<char> local_dd9;
  string local_dd8;
  undefined1 local_db8 [8];
  AssertionResult gtest_ar_40;
  Message local_da0;
  allocator<char> local_d91;
  string local_d90;
  undefined1 local_d70 [8];
  AssertionResult gtest_ar_39;
  Message local_d58;
  allocator<char> local_d49;
  string local_d48;
  string local_d28;
  undefined1 local_d08 [8];
  AssertionResult gtest_ar_38;
  Message local_cf0;
  allocator<char> local_ce1;
  string local_ce0;
  string local_cc0;
  undefined1 local_ca0 [8];
  AssertionResult gtest_ar_37;
  AssertHelper local_c70;
  Message local_c68;
  allocator<char> local_c59;
  string local_c58;
  bool local_c31;
  undefined1 local_c30 [8];
  AssertionResult gtest_ar_;
  Message local_c18;
  allocator<char> local_c09;
  string local_c08;
  double local_be8;
  int local_bdc;
  undefined1 local_bd8 [8];
  AssertionResult gtest_ar_36;
  Message local_bc0;
  allocator<char> local_bb1;
  string local_bb0;
  float local_b90;
  int local_b8c;
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_35;
  Message local_b70;
  allocator<char> local_b61;
  string local_b60;
  int64_t local_b40;
  int local_b34;
  undefined1 local_b30 [8];
  AssertionResult gtest_ar_34;
  Message local_b18;
  allocator<char> local_b09;
  string local_b08;
  int32_t local_ae8;
  int local_ae4;
  undefined1 local_ae0 [8];
  AssertionResult gtest_ar_33;
  Message local_ac8;
  allocator<char> local_ab9;
  string local_ab8;
  uint64_t local_a98;
  int local_a8c;
  undefined1 local_a88 [8];
  AssertionResult gtest_ar_32;
  Message local_a70;
  allocator<char> local_a61;
  string local_a60;
  uint32_t local_a40 [2];
  undefined1 local_a38 [8];
  AssertionResult gtest_ar_31;
  Message local_a20;
  allocator<char> local_a11;
  string local_a10;
  int64_t local_9f0;
  int local_9e4;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar_30;
  Message local_9c8;
  allocator<char> local_9b9;
  string local_9b8;
  int32_t local_998;
  int local_994;
  undefined1 local_990 [8];
  AssertionResult gtest_ar_29;
  Message local_978;
  allocator<char> local_969;
  string local_968;
  uint64_t local_948;
  int local_93c;
  undefined1 local_938 [8];
  AssertionResult gtest_ar_28;
  Message local_920;
  allocator<char> local_911;
  string local_910;
  uint32_t local_8f0 [2];
  undefined1 local_8e8 [8];
  AssertionResult gtest_ar_27;
  Message local_8d0;
  allocator<char> local_8c1;
  string local_8c0;
  int64_t local_8a0;
  int local_894;
  undefined1 local_890 [8];
  AssertionResult gtest_ar_26;
  Message local_878;
  allocator<char> local_869;
  string local_868;
  int32_t local_848;
  int local_844;
  undefined1 local_840 [8];
  AssertionResult gtest_ar_25;
  Message local_828;
  allocator<char> local_819;
  string local_818;
  int local_7f8 [2];
  undefined1 local_7f0 [8];
  AssertionResult gtest_ar_24;
  Message local_7d8;
  allocator<char> local_7c9;
  string local_7c8;
  int local_7a8 [2];
  undefined1 local_7a0 [8];
  AssertionResult gtest_ar_23;
  Message local_788;
  allocator<char> local_779;
  string local_778;
  int local_758 [2];
  undefined1 local_750 [8];
  AssertionResult gtest_ar_22;
  Message local_738;
  allocator<char> local_729;
  string local_728;
  int local_708 [2];
  undefined1 local_700 [8];
  AssertionResult gtest_ar_21;
  Message local_6e8;
  allocator<char> local_6d9;
  string local_6d8;
  int local_6b8 [2];
  undefined1 local_6b0 [8];
  AssertionResult gtest_ar_20;
  Message local_698;
  allocator<char> local_689;
  string local_688;
  int local_668 [2];
  undefined1 local_660 [8];
  AssertionResult gtest_ar_19;
  Message local_648;
  allocator<char> local_639;
  string local_638;
  int local_618 [2];
  undefined1 local_610 [8];
  AssertionResult gtest_ar_18;
  Message local_5f8;
  allocator<char> local_5e9;
  string local_5e8;
  int local_5c8 [2];
  undefined1 local_5c0 [8];
  AssertionResult gtest_ar_17;
  Message local_5a8;
  allocator<char> local_599;
  string local_598;
  int local_578 [2];
  undefined1 local_570 [8];
  AssertionResult gtest_ar_16;
  Message local_558;
  allocator<char> local_549;
  string local_548;
  int local_528 [2];
  undefined1 local_520 [8];
  AssertionResult gtest_ar_15;
  Message local_508;
  allocator<char> local_4f9;
  string local_4f8;
  int local_4d8 [2];
  undefined1 local_4d0 [8];
  AssertionResult gtest_ar_14;
  Message local_4b8;
  allocator<char> local_4a9;
  string local_4a8;
  int local_488 [2];
  undefined1 local_480 [8];
  AssertionResult gtest_ar_13;
  Message local_468;
  allocator<char> local_459;
  string local_458;
  int local_438 [2];
  undefined1 local_430 [8];
  AssertionResult gtest_ar_12;
  Message local_418;
  allocator<char> local_409;
  string local_408;
  int local_3e8 [2];
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_11;
  Message local_3c8;
  allocator<char> local_3b9;
  string local_3b8;
  int local_398 [2];
  undefined1 local_390 [8];
  AssertionResult gtest_ar_10;
  Message local_378;
  allocator<char> local_369;
  string local_368;
  int local_348 [2];
  undefined1 local_340 [8];
  AssertionResult gtest_ar_9;
  Message local_328;
  allocator<char> local_319;
  string local_318;
  int local_2f8 [2];
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_8;
  Message local_2d8;
  allocator<char> local_2c9;
  string local_2c8;
  int local_2a8 [2];
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_7;
  Message local_288;
  allocator<char> local_279;
  string local_278;
  int local_258 [2];
  undefined1 local_250 [8];
  AssertionResult gtest_ar_6;
  Message local_238;
  allocator<char> local_229;
  string local_228;
  int local_208 [2];
  undefined1 local_200 [8];
  AssertionResult gtest_ar_5;
  Message local_1e8;
  allocator<char> local_1d9;
  string local_1d8;
  int local_1b8 [2];
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_4;
  Message local_198;
  allocator<char> local_189;
  string local_188;
  int local_168 [2];
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Message local_148;
  allocator<char> local_139;
  string local_138;
  int local_118 [2];
  undefined1 local_110 [8];
  AssertionResult gtest_ar_2;
  Message local_f8;
  allocator<char> local_e9;
  string local_e8;
  int local_c8 [2];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_a8;
  Message local_a0 [3];
  allocator<char> local_81;
  string local_80;
  int local_60 [2];
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  Message *sub_message;
  string scratch;
  Reflection *reflection;
  Message *message_local;
  ReflectionTester *this_local;
  
  scratch.field_2._8_8_ = Message::GetReflection(message);
  std::__cxx11::string::string((string *)&sub_message);
  uVar1 = scratch.field_2._8_8_;
  local_60[1] = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"repeated_int32",&local_81)
  ;
  pFVar3 = F(this,&local_80);
  local_60[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_58,"2","reflection->FieldSize(message, F(\"repeated_int32\"))",
             local_60 + 1,local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar2) {
    testing::Message::Message(local_a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x24c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(local_a0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  uVar1 = scratch.field_2._8_8_;
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_c8[1] = 2;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"repeated_int64",&local_e9);
    pFVar3 = F(this,&local_e8);
    local_c8[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_c0,"2","reflection->FieldSize(message, F(\"repeated_int64\"))",
               local_c8 + 1,local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_f8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0x24d,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_f8);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    uVar1 = scratch.field_2._8_8_;
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_118[1] = 2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"repeated_uint32",&local_139);
      pFVar3 = F(this,&local_138);
      local_118[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_110,"2","reflection->FieldSize(message, F(\"repeated_uint32\"))",
                 local_118 + 1,local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::allocator<char>::~allocator(&local_139);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
      if (!bVar2) {
        testing::Message::Message(&local_148);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0x24e,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_148);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
      uVar1 = scratch.field_2._8_8_;
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_168[1] = 2;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"repeated_uint64",&local_189);
        pFVar3 = F(this,&local_188);
        local_168[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  ((EqHelper *)local_160,"2",
                   "reflection->FieldSize(message, F(\"repeated_uint64\"))",local_168 + 1,local_168)
        ;
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar2) {
          testing::Message::Message(&local_198);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0x24f,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_198);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_198);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        uVar1 = scratch.field_2._8_8_;
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_1b8[1] = 2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1d8,"repeated_sint32",&local_1d9);
          pFVar3 = F(this,&local_1d8);
          local_1b8[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1b0,"2",
                     "reflection->FieldSize(message, F(\"repeated_sint32\"))",local_1b8 + 1,
                     local_1b8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::allocator<char>::~allocator(&local_1d9);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
          if (!bVar2) {
            testing::Message::Message(&local_1e8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0x250,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_1e8);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
          uVar1 = scratch.field_2._8_8_;
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_208[1] = 2;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_228,"repeated_sint64",&local_229);
            pFVar3 = F(this,&local_228);
            local_208[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_200,"2",
                       "reflection->FieldSize(message, F(\"repeated_sint64\"))",local_208 + 1,
                       local_208);
            std::__cxx11::string::~string((string *)&local_228);
            std::allocator<char>::~allocator(&local_229);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
            if (!bVar2) {
              testing::Message::Message(&local_238);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0x251,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_238);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_238);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
            uVar1 = scratch.field_2._8_8_;
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_258[1] = 2;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_278,"repeated_fixed32",&local_279);
              pFVar3 = F(this,&local_278);
              local_258[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                        ((EqHelper *)local_250,"2",
                         "reflection->FieldSize(message, F(\"repeated_fixed32\"))",local_258 + 1,
                         local_258);
              std::__cxx11::string::~string((string *)&local_278);
              std::allocator<char>::~allocator(&local_279);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
              if (!bVar2) {
                testing::Message::Message(&local_288);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0x252,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_288);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_288);
              }
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
              uVar1 = scratch.field_2._8_8_;
              if (gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                local_2a8[1] = 2;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_2c8,"repeated_fixed64",&local_2c9);
                pFVar3 = F(this,&local_2c8);
                local_2a8[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_2a0,"2",
                           "reflection->FieldSize(message, F(\"repeated_fixed64\"))",local_2a8 + 1,
                           local_2a8);
                std::__cxx11::string::~string((string *)&local_2c8);
                std::allocator<char>::~allocator(&local_2c9);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2a0);
                if (!bVar2) {
                  testing::Message::Message(&local_2d8);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0x253,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_2d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_2d8);
                }
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
                uVar1 = scratch.field_2._8_8_;
                if (gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_2f8[1] = 2;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_318,"repeated_sfixed32",&local_319);
                  pFVar3 = F(this,&local_318);
                  local_2f8[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_2f0,"2",
                             "reflection->FieldSize(message, F(\"repeated_sfixed32\"))",
                             local_2f8 + 1,local_2f8);
                  std::__cxx11::string::~string((string *)&local_318);
                  std::allocator<char>::~allocator(&local_319);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2f0);
                  if (!bVar2) {
                    testing::Message::Message(&local_328);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0x254,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_328);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_328);
                  }
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar_1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                  uVar1 = scratch.field_2._8_8_;
                  if (gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    local_348[1] = 2;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_368,"repeated_sfixed64",&local_369);
                    pFVar3 = F(this,&local_368);
                    local_348[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                              ((EqHelper *)local_340,"2",
                               "reflection->FieldSize(message, F(\"repeated_sfixed64\"))",
                               local_348 + 1,local_348);
                    std::__cxx11::string::~string((string *)&local_368);
                    std::allocator<char>::~allocator(&local_369);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_340);
                    if (!bVar2) {
                      testing::Message::Message(&local_378);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_340);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0x255,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_378);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_378);
                    }
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._5_3_ = 0;
                    gtest_ar_1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_1_ = !bVar2;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
                    uVar1 = scratch.field_2._8_8_;
                    if (gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_ == 0) {
                      local_398[1] = 2;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_3b8,"repeated_float",&local_3b9);
                      pFVar3 = F(this,&local_3b8);
                      local_398[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_390,"2",
                                 "reflection->FieldSize(message, F(\"repeated_float\"))",
                                 local_398 + 1,local_398);
                      std::__cxx11::string::~string((string *)&local_3b8);
                      std::allocator<char>::~allocator(&local_3b9);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_390);
                      if (!bVar2) {
                        testing::Message::Message(&local_3c8);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_390);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0x256,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_11.message_,&local_3c8);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_11.message_);
                        testing::Message::~Message(&local_3c8);
                      }
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar2;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
                      uVar1 = scratch.field_2._8_8_;
                      if (gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0) {
                        local_3e8[1] = 2;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_408,"repeated_double",&local_409);
                        pFVar3 = F(this,&local_408);
                        local_3e8[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_3e0,"2",
                                   "reflection->FieldSize(message, F(\"repeated_double\"))",
                                   local_3e8 + 1,local_3e8);
                        std::__cxx11::string::~string((string *)&local_408);
                        std::allocator<char>::~allocator(&local_409);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_3e0);
                        if (!bVar2) {
                          testing::Message::Message(&local_418);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_3e0);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,599,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_418);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_418);
                        }
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar2;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
                        uVar1 = scratch.field_2._8_8_;
                        if (gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_438[1] = 2;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_458,"repeated_bool",&local_459);
                          pFVar3 = F(this,&local_458);
                          local_438[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_430,"2",
                                     "reflection->FieldSize(message, F(\"repeated_bool\"))",
                                     local_438 + 1,local_438);
                          std::__cxx11::string::~string((string *)&local_458);
                          std::allocator<char>::~allocator(&local_459);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_430);
                          if (!bVar2) {
                            testing::Message::Message(&local_468);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_430);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,600,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_13.message_,&local_468);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar_13.message_);
                            testing::Message::~Message(&local_468);
                          }
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar_1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar2;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
                          uVar1 = scratch.field_2._8_8_;
                          if (gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            local_488[1] = 2;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_4a8,"repeated_string",&local_4a9);
                            pFVar3 = F(this,&local_4a8);
                            local_488[0] = Reflection::FieldSize((Reflection *)uVar1,message,pFVar3)
                            ;
                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                      ((EqHelper *)local_480,"2",
                                       "reflection->FieldSize(message, F(\"repeated_string\"))",
                                       local_488 + 1,local_488);
                            std::__cxx11::string::~string((string *)&local_4a8);
                            std::allocator<char>::~allocator(&local_4a9);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_480);
                            if (!bVar2) {
                              testing::Message::Message(&local_4b8);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_480);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0x259,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_14.message_,&local_4b8);
                              testing::internal::AssertHelper::~AssertHelper
                                        ((AssertHelper *)&gtest_ar_14.message_);
                              testing::Message::~Message(&local_4b8);
                            }
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar2;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_480)
                            ;
                            uVar1 = scratch.field_2._8_8_;
                            if (gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              local_4d8[1] = 2;
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_4f8,"repeated_bytes",&local_4f9);
                              pFVar3 = F(this,&local_4f8);
                              local_4d8[0] = Reflection::FieldSize
                                                       ((Reflection *)uVar1,message,pFVar3);
                              testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                        ((EqHelper *)local_4d0,"2",
                                         "reflection->FieldSize(message, F(\"repeated_bytes\"))",
                                         local_4d8 + 1,local_4d8);
                              std::__cxx11::string::~string((string *)&local_4f8);
                              std::allocator<char>::~allocator(&local_4f9);
                              bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4d0);
                              if (!bVar2) {
                                testing::Message::Message(&local_508);
                                pcVar4 = testing::AssertionResult::failure_message
                                                   ((AssertionResult *)local_4d0);
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0x25a,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_15.message_,&local_508);
                                testing::internal::AssertHelper::~AssertHelper
                                          ((AssertHelper *)&gtest_ar_15.message_);
                                testing::Message::~Message(&local_508);
                              }
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._5_3_ = 0;
                              gtest_ar_1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_1_ = !bVar2;
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4d0);
                              uVar1 = scratch.field_2._8_8_;
                              if (gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_ == 0) {
                                local_528[1] = 2;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_548,"repeatedgroup",&local_549);
                                pFVar3 = F(this,&local_548);
                                local_528[0] = Reflection::FieldSize
                                                         ((Reflection *)uVar1,message,pFVar3);
                                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                          ((EqHelper *)local_520,"2",
                                           "reflection->FieldSize(message, F(\"repeatedgroup\"))",
                                           local_528 + 1,local_528);
                                std::__cxx11::string::~string((string *)&local_548);
                                std::allocator<char>::~allocator(&local_549);
                                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_520);
                                if (!bVar2) {
                                  testing::Message::Message(&local_558);
                                  pcVar4 = testing::AssertionResult::failure_message
                                                     ((AssertionResult *)local_520);
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0x25c,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_16.message_,&local_558);
                                  testing::internal::AssertHelper::~AssertHelper
                                            ((AssertHelper *)&gtest_ar_16.message_);
                                  testing::Message::~Message(&local_558);
                                }
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._5_3_ = 0;
                                gtest_ar_1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_1_ = !bVar2;
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_520);
                                uVar1 = scratch.field_2._8_8_;
                                if (gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_ == 0) {
                                  local_578[1] = 2;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_598,"repeated_nested_message",
                                             &local_599);
                                  pFVar3 = F(this,&local_598);
                                  local_578[0] = Reflection::FieldSize
                                                           ((Reflection *)uVar1,message,pFVar3);
                                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                            ((EqHelper *)local_570,"2",
                                             "reflection->FieldSize(message, F(\"repeated_nested_message\"))"
                                             ,local_578 + 1,local_578);
                                  std::__cxx11::string::~string((string *)&local_598);
                                  std::allocator<char>::~allocator(&local_599);
                                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_570);
                                  if (!bVar2) {
                                    testing::Message::Message(&local_5a8);
                                    pcVar4 = testing::AssertionResult::failure_message
                                                       ((AssertionResult *)local_570);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0x25d,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_17.message_,&local_5a8);
                                    testing::internal::AssertHelper::~AssertHelper
                                              ((AssertHelper *)&gtest_ar_17.message_);
                                    testing::Message::~Message(&local_5a8);
                                  }
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._5_3_ = 0;
                                  gtest_ar_1.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_1_ = !bVar2;
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_570);
                                  uVar1 = scratch.field_2._8_8_;
                                  if (gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_4_ == 0) {
                                    local_5c8[1] = 2;
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_5e8,"repeated_foreign_message",
                                               &local_5e9);
                                    pFVar3 = F(this,&local_5e8);
                                    local_5c8[0] = Reflection::FieldSize
                                                             ((Reflection *)uVar1,message,pFVar3);
                                    testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                              ((EqHelper *)local_5c0,"2",
                                               "reflection->FieldSize(message, F(\"repeated_foreign_message\"))"
                                               ,local_5c8 + 1,local_5c8);
                                    std::__cxx11::string::~string((string *)&local_5e8);
                                    std::allocator<char>::~allocator(&local_5e9);
                                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_5c0);
                                    if (!bVar2) {
                                      testing::Message::Message(&local_5f8);
                                      pcVar4 = testing::AssertionResult::failure_message
                                                         ((AssertionResult *)local_5c0);
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_,kFatalFailure
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0x25e,pcVar4);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_18.message_,&local_5f8);
                                      testing::internal::AssertHelper::~AssertHelper
                                                ((AssertHelper *)&gtest_ar_18.message_);
                                      testing::Message::~Message(&local_5f8);
                                    }
                                    gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._5_3_ = 0;
                                    gtest_ar_1.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_1_ = !bVar2;
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_5c0);
                                    uVar1 = scratch.field_2._8_8_;
                                    if (gtest_ar_1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_4_ == 0) {
                                      local_618[1] = 2;
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_638,"repeated_import_message",
                                                 &local_639);
                                      pFVar3 = F(this,&local_638);
                                      local_618[0] = Reflection::FieldSize
                                                               ((Reflection *)uVar1,message,pFVar3);
                                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                ((EqHelper *)local_610,"2",
                                                 "reflection->FieldSize(message, F(\"repeated_import_message\"))"
                                                 ,local_618 + 1,local_618);
                                      std::__cxx11::string::~string((string *)&local_638);
                                      std::allocator<char>::~allocator(&local_639);
                                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_610);
                                      if (!bVar2) {
                                        testing::Message::Message(&local_648);
                                        pcVar4 = testing::AssertionResult::failure_message
                                                           ((AssertionResult *)local_610);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_,
                                                   kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x25f,pcVar4);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_19.message_,&local_648)
                                        ;
                                        testing::internal::AssertHelper::~AssertHelper
                                                  ((AssertHelper *)&gtest_ar_19.message_);
                                        testing::Message::~Message(&local_648);
                                      }
                                      gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._5_3_ = 0;
                                      gtest_ar_1.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl._4_1_ = !bVar2;
                                      testing::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_610);
                                      uVar1 = scratch.field_2._8_8_;
                                      if (gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_4_ == 0) {
                                        local_668[1] = 2;
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_688,"repeated_lazy_message",
                                                   &local_689);
                                        pFVar3 = F(this,&local_688);
                                        local_668[0] = Reflection::FieldSize
                                                                 ((Reflection *)uVar1,message,pFVar3
                                                                 );
                                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                  ((EqHelper *)local_660,"2",
                                                                                                      
                                                  "reflection->FieldSize(message, F(\"repeated_lazy_message\"))"
                                                  ,local_668 + 1,local_668);
                                        std::__cxx11::string::~string((string *)&local_688);
                                        std::allocator<char>::~allocator(&local_689);
                                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_660);
                                        if (!bVar2) {
                                          testing::Message::Message(&local_698);
                                          pcVar4 = testing::AssertionResult::failure_message
                                                             ((AssertionResult *)local_660);
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_20.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x260,pcVar4);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_20.message_,
                                                     &local_698);
                                          testing::internal::AssertHelper::~AssertHelper
                                                    ((AssertHelper *)&gtest_ar_20.message_);
                                          testing::Message::~Message(&local_698);
                                        }
                                        gtest_ar_1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._5_3_ = 0;
                                        gtest_ar_1.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl._4_1_ = !bVar2;
                                        testing::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_660);
                                        uVar1 = scratch.field_2._8_8_;
                                        if (gtest_ar_1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_4_ == 0) {
                                          local_6b8[1] = 2;
                                          std::allocator<char>::allocator();
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_6d8,"repeated_nested_enum",
                                                     &local_6d9);
                                          pFVar3 = F(this,&local_6d8);
                                          local_6b8[0] = Reflection::FieldSize
                                                                   ((Reflection *)uVar1,message,
                                                                    pFVar3);
                                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                    ((EqHelper *)local_6b0,"2",
                                                                                                          
                                                  "reflection->FieldSize(message, F(\"repeated_nested_enum\"))"
                                                  ,local_6b8 + 1,local_6b8);
                                          std::__cxx11::string::~string((string *)&local_6d8);
                                          std::allocator<char>::~allocator(&local_6d9);
                                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_6b0);
                                          if (!bVar2) {
                                            testing::Message::Message(&local_6e8);
                                            pcVar4 = testing::AssertionResult::failure_message
                                                               ((AssertionResult *)local_6b0);
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_21.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x261,pcVar4);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_21.message_,
                                                       &local_6e8);
                                            testing::internal::AssertHelper::~AssertHelper
                                                      ((AssertHelper *)&gtest_ar_21.message_);
                                            testing::Message::~Message(&local_6e8);
                                          }
                                          gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._5_3_ = 0;
                                          gtest_ar_1.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl._4_1_ = !bVar2;
                                          testing::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_6b0);
                                          uVar1 = scratch.field_2._8_8_;
                                          if (gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_4_ == 0) {
                                            local_708[1] = 2;
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_728,"repeated_foreign_enum",
                                                       &local_729);
                                            pFVar3 = F(this,&local_728);
                                            local_708[0] = Reflection::FieldSize
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3);
                                            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                                      ((EqHelper *)local_700,"2",
                                                                                                              
                                                  "reflection->FieldSize(message, F(\"repeated_foreign_enum\"))"
                                                  ,local_708 + 1,local_708);
                                            std::__cxx11::string::~string((string *)&local_728);
                                            std::allocator<char>::~allocator(&local_729);
                                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_700);
                                            if (!bVar2) {
                                              testing::Message::Message(&local_738);
                                              pcVar4 = testing::AssertionResult::failure_message
                                                                 ((AssertionResult *)local_700);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_22.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x262,pcVar4);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_22.message_,
                                                         &local_738);
                                              testing::internal::AssertHelper::~AssertHelper
                                                        ((AssertHelper *)&gtest_ar_22.message_);
                                              testing::Message::~Message(&local_738);
                                            }
                                            gtest_ar_1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._5_3_ = 0;
                                            gtest_ar_1.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl._4_1_ = !bVar2;
                                            testing::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_700);
                                            uVar1 = scratch.field_2._8_8_;
                                            if (gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_4_ == 0) {
                                              local_758[1] = 2;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_778,"repeated_import_enum"
                                                         ,&local_779);
                                              pFVar3 = F(this,&local_778);
                                              local_758[0] = Reflection::FieldSize
                                                                       ((Reflection *)uVar1,message,
                                                                        pFVar3);
                                              testing::internal::EqHelper::
                                              Compare<int,_int,_nullptr>
                                                        ((EqHelper *)local_750,"2",
                                                                                                                  
                                                  "reflection->FieldSize(message, F(\"repeated_import_enum\"))"
                                                  ,local_758 + 1,local_758);
                                              std::__cxx11::string::~string((string *)&local_778);
                                              std::allocator<char>::~allocator(&local_779);
                                              bVar2 = testing::AssertionResult::
                                                      operator_cast_to_bool
                                                                ((AssertionResult *)local_750);
                                              if (!bVar2) {
                                                testing::Message::Message(&local_788);
                                                pcVar4 = testing::AssertionResult::failure_message
                                                                   ((AssertionResult *)local_750);
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_23.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x263,pcVar4);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_23.message_,
                                                           &local_788);
                                                testing::internal::AssertHelper::~AssertHelper
                                                          ((AssertHelper *)&gtest_ar_23.message_);
                                                testing::Message::~Message(&local_788);
                                              }
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._5_3_ = 0;
                                              gtest_ar_1.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl._4_1_ = !bVar2;
                                              testing::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_750);
                                              uVar1 = scratch.field_2._8_8_;
                                              if (gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                local_7a8[1] = 2;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_7c8,
                                                           "repeated_string_piece",&local_7c9);
                                                pFVar3 = F(this,&local_7c8);
                                                local_7a8[0] = Reflection::FieldSize
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3);
                                                testing::internal::EqHelper::
                                                Compare<int,_int,_nullptr>
                                                          ((EqHelper *)local_7a0,"2",
                                                                                                                      
                                                  "reflection->FieldSize(message, F(\"repeated_string_piece\"))"
                                                  ,local_7a8 + 1,local_7a8);
                                                std::__cxx11::string::~string((string *)&local_7c8);
                                                std::allocator<char>::~allocator(&local_7c9);
                                                bVar2 = testing::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_7a0);
                                                if (!bVar2) {
                                                  testing::Message::Message(&local_7d8);
                                                  pcVar4 = testing::AssertionResult::failure_message
                                                                     ((AssertionResult *)local_7a0);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x265,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_24.message_,
                                                             &local_7d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_24.message_);
                                                  testing::Message::~Message(&local_7d8);
                                                }
                                                gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._5_3_ = 0;
                                                gtest_ar_1.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl._4_1_ = !bVar2;
                                                testing::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_7a0);
                                                uVar1 = scratch.field_2._8_8_;
                                                if (gtest_ar_1.message_._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                  local_7f8[1] = 2;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_818,"repeated_cord",
                                                             &local_819);
                                                  pFVar3 = F(this,&local_818);
                                                  local_7f8[0] = Reflection::FieldSize
                                                                           ((Reflection *)uVar1,
                                                                            message,pFVar3);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_7f0,"2",
                                                                                                                          
                                                  "reflection->FieldSize(message, F(\"repeated_cord\"))"
                                                  ,local_7f8 + 1,local_7f8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_818);
                                                  std::allocator<char>::~allocator(&local_819);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_7f0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_828);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_7f0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_25.message_
                                                               ,kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x266,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_25.message_,
                                                             &local_828);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_25.message_);
                                                  testing::Message::~Message(&local_828);
                                                  }
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._5_3_ = 0;
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_1_ = !bVar2;
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7f0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  if (gtest_ar_1.message_._M_t.
                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ == 0) {
                                                    local_844 = 0xc9;
                                                    std::allocator<char>::allocator();
                                                    std::__cxx11::string::
                                                    string<std::allocator<char>>
                                                              ((string *)&local_868,"repeated_int32"
                                                               ,&local_869);
                                                    pFVar3 = F(this,&local_868);
                                                    local_848 = Reflection::GetRepeatedInt32
                                                                          ((Reflection *)uVar1,
                                                                           message,pFVar3,0);
                                                    testing::internal::EqHelper::
                                                    Compare<int,_int,_nullptr>
                                                              ((EqHelper *)local_840,"201",
                                                                                                                              
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_int32\"), 0)"
                                                  ,&local_844,&local_848);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_868);
                                                  std::allocator<char>::~allocator(&local_869);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_840);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_878);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_840);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_26.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x268,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_26.message_,
                                                             &local_878);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_26.message_);
                                                  testing::Message::~Message(&local_878);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_840);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_894 = 0xca;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_8c0,"repeated_int64",
                                                             &local_8c1);
                                                  pFVar3 = F(this,&local_8c0);
                                                  local_8a0 = Reflection::GetRepeatedInt64
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_890,"202",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_int64\"), 0)"
                                                  ,&local_894,&local_8a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_8c0);
                                                  std::allocator<char>::~allocator(&local_8c1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_890);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_8d0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_890);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_27.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x269,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_27.message_,
                                                             &local_8d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_27.message_);
                                                  testing::Message::~Message(&local_8d0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_890);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_8f0[1] = 0xcb;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_910,"repeated_uint32",
                                                             &local_911);
                                                  pFVar3 = F(this,&local_910);
                                                  local_8f0[0] = Reflection::GetRepeatedUInt32
                                                                           ((Reflection *)uVar1,
                                                                            message,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_8e8,"203",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_uint32\"), 0)"
                                                  ,(int *)(local_8f0 + 1),local_8f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_910);
                                                  std::allocator<char>::~allocator(&local_911);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_8e8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_920);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_8e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_28.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26b,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_28.message_,
                                                             &local_920);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_28.message_);
                                                  testing::Message::~Message(&local_920);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8e8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_93c = 0xcc;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_968,"repeated_uint64",
                                                             &local_969);
                                                  pFVar3 = F(this,&local_968);
                                                  local_948 = Reflection::GetRepeatedUInt64
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_938,"204",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_uint64\"), 0)"
                                                  ,&local_93c,&local_948);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_968);
                                                  std::allocator<char>::~allocator(&local_969);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_938);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_978);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_938);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_29.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26d,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_29.message_,
                                                             &local_978);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_29.message_);
                                                  testing::Message::~Message(&local_978);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_938);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_994 = 0xcd;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_9b8,"repeated_sint32",
                                                             &local_9b9);
                                                  pFVar3 = F(this,&local_9b8);
                                                  local_998 = Reflection::GetRepeatedInt32
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_990,"205",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sint32\"), 0)"
                                                  ,&local_994,&local_998);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_9b8);
                                                  std::allocator<char>::~allocator(&local_9b9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_990);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_9c8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_990);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_30.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26f,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_30.message_,
                                                             &local_9c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_30.message_);
                                                  testing::Message::~Message(&local_9c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_990);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_9e4 = 0xce;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_a10,"repeated_sint64",
                                                             &local_a11);
                                                  pFVar3 = F(this,&local_a10);
                                                  local_9f0 = Reflection::GetRepeatedInt64
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_9e0,"206",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sint64\"), 0)"
                                                  ,&local_9e4,&local_9f0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_a10);
                                                  std::allocator<char>::~allocator(&local_a11);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_9e0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_a20);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_9e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_31.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x271,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_31.message_,
                                                             &local_a20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_31.message_);
                                                  testing::Message::~Message(&local_a20);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9e0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_a40[1] = 0xcf;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_a60,"repeated_fixed32"
                                                             ,&local_a61);
                                                  pFVar3 = F(this,&local_a60);
                                                  local_a40[0] = Reflection::GetRepeatedUInt32
                                                                           ((Reflection *)uVar1,
                                                                            message,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_a38,"207",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_fixed32\"), 0)"
                                                  ,(int *)(local_a40 + 1),local_a40);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_a60);
                                                  std::allocator<char>::~allocator(&local_a61);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_a38);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_a70);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_a38);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_32.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x273,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_32.message_,
                                                             &local_a70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_32.message_);
                                                  testing::Message::~Message(&local_a70);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a38);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_a8c = 0xd0;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_ab8,"repeated_fixed64"
                                                             ,&local_ab9);
                                                  pFVar3 = F(this,&local_ab8);
                                                  local_a98 = Reflection::GetRepeatedUInt64
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_a88,"208",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_fixed64\"), 0)"
                                                  ,&local_a8c,&local_a98);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_ab8);
                                                  std::allocator<char>::~allocator(&local_ab9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_a88);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_ac8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_a88);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_33.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x275,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_33.message_,
                                                             &local_ac8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_33.message_);
                                                  testing::Message::~Message(&local_ac8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_a88);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_ae4 = 0xd1;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_b08,
                                                             "repeated_sfixed32",&local_b09);
                                                  pFVar3 = F(this,&local_b08);
                                                  local_ae8 = Reflection::GetRepeatedInt32
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_ae0,"209",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sfixed32\"), 0)"
                                                  ,&local_ae4,&local_ae8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b08);
                                                  std::allocator<char>::~allocator(&local_b09);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_ae0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_b18);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_ae0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_34.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x277,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_34.message_,
                                                             &local_b18);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_34.message_);
                                                  testing::Message::~Message(&local_b18);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ae0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_b34 = 0xd2;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_b60,
                                                             "repeated_sfixed64",&local_b61);
                                                  pFVar3 = F(this,&local_b60);
                                                  local_b40 = Reflection::GetRepeatedInt64
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_b30,"210",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sfixed64\"), 0)"
                                                  ,&local_b34,&local_b40);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b60);
                                                  std::allocator<char>::~allocator(&local_b61);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_b30);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_b70);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_b30);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_35.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x279,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_35.message_,
                                                             &local_b70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_35.message_);
                                                  testing::Message::~Message(&local_b70);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b30);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_b8c = 0xd3;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_bb0,"repeated_float",
                                                             &local_bb1);
                                                  pFVar3 = F(this,&local_bb0);
                                                  local_b90 = Reflection::GetRepeatedFloat
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_float,_nullptr>
                                                            ((EqHelper *)local_b88,"211",
                                                                                                                          
                                                  "reflection->GetRepeatedFloat(message, F(\"repeated_float\"), 0)"
                                                  ,&local_b8c,&local_b90);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_bb0);
                                                  std::allocator<char>::~allocator(&local_bb1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_b88);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_bc0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_b88);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_36.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27a,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_36.message_,
                                                             &local_bc0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_36.message_);
                                                  testing::Message::~Message(&local_bc0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_b88);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_bdc = 0xd4;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_c08,"repeated_double",
                                                             &local_c09);
                                                  pFVar3 = F(this,&local_c08);
                                                  local_be8 = Reflection::GetRepeatedDouble
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_double,_nullptr>
                                                            ((EqHelper *)local_bd8,"212",
                                                                                                                          
                                                  "reflection->GetRepeatedDouble(message, F(\"repeated_double\"), 0)"
                                                  ,&local_bdc,&local_be8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c08);
                                                  std::allocator<char>::~allocator(&local_c09);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_bd8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_c18);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_bd8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27c,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             &local_c18);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  testing::Message::~Message(&local_c18);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_bd8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_c58,"repeated_bool",
                                                             &local_c59);
                                                  pFVar3 = F(this,&local_c58);
                                                  local_c31 = Reflection::GetRepeatedBool
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_c30,&local_c31
                                                             ,(type *)0x0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c58);
                                                  std::allocator<char>::~allocator(&local_c59);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_c30);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_c68);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_37.message_,
                                                               (internal *)local_c30,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "reflection->GetRepeatedBool(message, F(\"repeated_bool\"), 0)"
                                                  ,"false","true",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_c70,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27d,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_c70,&local_c68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_c70);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_37.message_);
                                                  testing::Message::~Message(&local_c68);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_c30);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_ce0,"repeated_string",
                                                             &local_ce1);
                                                  pFVar3 = F(this,&local_ce0);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_cc0,(Reflection *)uVar1,message,
                                                             pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_ca0,"\"215\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_string\"), 0)"
                                                  ,(char (*) [4])"215",&local_cc0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_cc0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_ce0);
                                                  std::allocator<char>::~allocator(&local_ce1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_ca0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_cf0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_ca0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_38.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27f,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_38.message_,
                                                             &local_cf0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_38.message_);
                                                  testing::Message::~Message(&local_cf0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ca0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_d48,"repeated_bytes",
                                                             &local_d49);
                                                  pFVar3 = F(this,&local_d48);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_d28,(Reflection *)uVar1,message,
                                                             pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_d08,"\"216\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_bytes\"), 0)"
                                                  ,(char (*) [4])"216",&local_d28);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d28);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d48);
                                                  std::allocator<char>::~allocator(&local_d49);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_d08);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_d58);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_d08);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_39.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x281,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_39.message_,
                                                             &local_d58);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_39.message_);
                                                  testing::Message::~Message(&local_d58);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d08);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_d90,"repeated_string",
                                                             &local_d91);
                                                  pFVar3 = F(this,&local_d90);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,0,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_d70,"\"215\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string\"), 0, &scratch)"
                                                  ,(char (*) [4])"215",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d90);
                                                  std::allocator<char>::~allocator(&local_d91);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_d70);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_da0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_d70);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_40.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x284,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_40.message_,
                                                             &local_da0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_40.message_);
                                                  testing::Message::~Message(&local_da0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_d70);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_dd8,"repeated_bytes",
                                                             &local_dd9);
                                                  pFVar3 = F(this,&local_dd8);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,0,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_db8,"\"216\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_bytes\"), 0, &scratch)"
                                                  ,(char (*) [4])"216",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_dd8);
                                                  std::allocator<char>::~allocator(&local_dd9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_db8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_de8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_db8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_df0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x286,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_df0,&local_de8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_df0);
                                                  testing::Message::~Message(&local_de8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_db8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_e10,"repeatedgroup",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_41.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_e10);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_e10);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_41.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_e2c = 0xd9;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_e30 = Reflection::GetInt32
                                                                        (pRVar6,(Message *)
                                                                                gtest_ar.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->repeated_group_a_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_e28,"217",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, repeated_group_a_)"
                                                  ,&local_e2c,&local_e30);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_e28);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_e38);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_e28);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e40,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x28a,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e40,&local_e38);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e40);
                                                  testing::Message::~Message(&local_e38);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e28);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_e60,
                                                             "repeated_nested_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_42.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_e60);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_e60);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_42.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_e7c = 0xda;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_e80 = Reflection::GetInt32
                                                                        (pRVar6,(Message *)
                                                                                gtest_ar.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->nested_b_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_e78,"218",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,&local_e7c,&local_e80);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_e78);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_e88);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_e78);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_e90,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x28e,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_e90,&local_e88);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_e90);
                                                  testing::Message::~Message(&local_e88);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_e78);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_eb0,
                                                             "repeated_foreign_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_43.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_eb0);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_eb0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_43.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_ecc = 0xdb;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_ed0 = Reflection::GetInt32
                                                                        (pRVar6,(Message *)
                                                                                gtest_ar.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->foreign_c_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_ec8,"219",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_)"
                                                  ,&local_ecc,&local_ed0);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_ec8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_ed8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_ec8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_ee0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x292,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_ee0,&local_ed8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_ee0);
                                                  testing::Message::~Message(&local_ed8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_ec8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_f00,
                                                             "repeated_import_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_44.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_f00);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_f00);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_44.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_f1c = 0xdc;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_f20 = Reflection::GetInt32
                                                                        (pRVar6,(Message *)
                                                                                gtest_ar.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->import_d_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_f18,"220",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, import_d_)"
                                                  ,&local_f1c,&local_f20);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_f18);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_f28);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_f18);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_f30,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x296,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_f30,&local_f28);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_f30);
                                                  testing::Message::~Message(&local_f28);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f18);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_f50,
                                                             "repeated_lazy_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_45.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_f50);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_f50);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_45.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_f6c = 0xe3;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_f70 = Reflection::GetInt32
                                                                        (pRVar6,(Message *)
                                                                                gtest_ar.message_.
                                                                                _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->nested_b_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_f68,"227",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,&local_f6c,&local_f70);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_f68);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_f78);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_f68);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_46.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29a,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_46.message_,
                                                             &local_f78);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_46.message_);
                                                  testing::Message::~Message(&local_f78);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f68);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_fb8,
                                                             "repeated_nested_enum",&local_fb9);
                                                  pFVar3 = F(this,&local_fb8);
                                                  local_f98 = Reflection::GetRepeatedEnum
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
                                                            ((EqHelper *)local_f90,"nested_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_nested_enum\"), 0)"
                                                  ,&this->nested_bar_,&local_f98);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_fb8);
                                                  std::allocator<char>::~allocator(&local_fb9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_f90);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_fc8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_f90);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_47.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29d,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_47.message_,
                                                             &local_fc8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_47.message_);
                                                  testing::Message::~Message(&local_fc8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_f90);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1008,
                                                             "repeated_foreign_enum",&local_1009);
                                                  pFVar3 = F(this,&local_1008);
                                                  local_fe8 = Reflection::GetRepeatedEnum
                                                                        ((Reflection *)uVar1,message
                                                                         ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
                                                            ((EqHelper *)local_fe0,"foreign_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum( message, F(\"repeated_foreign_enum\"), 0)"
                                                  ,&this->foreign_bar_,&local_fe8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1008);
                                                  std::allocator<char>::~allocator(&local_1009);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_fe0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1018);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_fe0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_48.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29f,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_48.message_,
                                                             &local_1018);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_48.message_);
                                                  testing::Message::~Message(&local_1018);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_fe0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1058,
                                                             "repeated_import_enum",&local_1059);
                                                  pFVar3 = F(this,&local_1058);
                                                  local_1038 = Reflection::GetRepeatedEnum
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
                                                            ((EqHelper *)local_1030,"import_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_import_enum\"), 0)"
                                                  ,&this->import_bar_,&local_1038);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1058);
                                                  std::allocator<char>::~allocator(&local_1059);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1030);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1068);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1030);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_49.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a1,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_49.message_,
                                                             &local_1068);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_49.message_);
                                                  testing::Message::~Message(&local_1068);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1030);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_10c0,
                                                             "repeated_string_piece",&local_10c1);
                                                  pFVar3 = F(this,&local_10c0);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_10a0,(Reflection *)uVar1,message
                                                             ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1080,"\"224\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString( message, F(\"repeated_string_piece\"), 0)"
                                                  ,(char (*) [4])"224",&local_10a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_10a0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_10c0);
                                                  std::allocator<char>::~allocator(&local_10c1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1080);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_10d0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1080);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_50.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a4,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_50.message_,
                                                             &local_10d0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_50.message_);
                                                  testing::Message::~Message(&local_10d0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1080);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1108,
                                                             "repeated_string_piece",&local_1109);
                                                  pFVar3 = F(this,&local_1108);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,0,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_10e8,"\"224\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string_piece\"), 0, &scratch)"
                                                  ,(char (*) [4])"224",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1108);
                                                  std::allocator<char>::~allocator(&local_1109);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_10e8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1118);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_10e8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_51.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a6,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_51.message_,
                                                             &local_1118);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_51.message_);
                                                  testing::Message::~Message(&local_1118);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_10e8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1170,"repeated_cord",
                                                             &local_1171);
                                                  pFVar3 = F(this,&local_1170);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_1150,(Reflection *)uVar1,message
                                                             ,pFVar3,0);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1130,"\"225\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_cord\"), 0)"
                                                  ,(char (*) [4])"225",&local_1150);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1150);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1170);
                                                  std::allocator<char>::~allocator(&local_1171);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1130);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1180);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1130);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_52.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a9,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_52.message_,
                                                             &local_1180);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_52.message_);
                                                  testing::Message::~Message(&local_1180);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1130);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_11b8,"repeated_cord",
                                                             &local_11b9);
                                                  pFVar3 = F(this,&local_11b8);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,0,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1198,"\"225\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_cord\"), 0, &scratch)"
                                                  ,(char (*) [4])"225",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_11b8);
                                                  std::allocator<char>::~allocator(&local_11b9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1198);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_11c8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1198);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_53.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ab,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_53.message_,
                                                             &local_11c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_53.message_);
                                                  testing::Message::~Message(&local_11c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1198);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_11e4 = 0x12d;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1208,"repeated_int32",
                                                             &local_1209);
                                                  pFVar3 = F(this,&local_1208);
                                                  local_11e8 = Reflection::GetRepeatedInt32
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_11e0,"301",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_int32\"), 1)"
                                                  ,&local_11e4,&local_11e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1208);
                                                  std::allocator<char>::~allocator(&local_1209);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_11e0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1218);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_11e0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_54.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ad,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_54.message_,
                                                             &local_1218);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_54.message_);
                                                  testing::Message::~Message(&local_1218);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_11e0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_1234 = 0x12e;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1260,"repeated_int64",
                                                             &local_1261);
                                                  pFVar3 = F(this,&local_1260);
                                                  local_1240 = Reflection::GetRepeatedInt64
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1230,"302",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_int64\"), 1)"
                                                  ,&local_1234,&local_1240);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1260);
                                                  std::allocator<char>::~allocator(&local_1261);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1230);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1270);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1230);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_55.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ae,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_55.message_,
                                                             &local_1270);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_55.message_);
                                                  testing::Message::~Message(&local_1270);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1230);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_1290[1] = 0x12f;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_12b0,"repeated_uint32"
                                                             ,&local_12b1);
                                                  pFVar3 = F(this,&local_12b0);
                                                  local_1290[0] =
                                                       Reflection::GetRepeatedUInt32
                                                                 ((Reflection *)uVar1,message,pFVar3
                                                                  ,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_1288,"303",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_uint32\"), 1)"
                                                  ,(int *)(local_1290 + 1),local_1290);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_12b0);
                                                  std::allocator<char>::~allocator(&local_12b1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1288);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_12c0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1288);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_56.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b0,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_56.message_,
                                                             &local_12c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_56.message_);
                                                  testing::Message::~Message(&local_12c0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1288);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_12dc = 0x130;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1308,"repeated_uint64"
                                                             ,&local_1309);
                                                  pFVar3 = F(this,&local_1308);
                                                  local_12e8 = Reflection::GetRepeatedUInt64
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_12d8,"304",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_uint64\"), 1)"
                                                  ,&local_12dc,&local_12e8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1308);
                                                  std::allocator<char>::~allocator(&local_1309);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_12d8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1318);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_12d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_57.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b2,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_57.message_,
                                                             &local_1318);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_57.message_);
                                                  testing::Message::~Message(&local_1318);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_12d8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_1334 = 0x131;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1358,"repeated_sint32"
                                                             ,&local_1359);
                                                  pFVar3 = F(this,&local_1358);
                                                  local_1338 = Reflection::GetRepeatedInt32
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1330,"305",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sint32\"), 1)"
                                                  ,&local_1334,&local_1338);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1358);
                                                  std::allocator<char>::~allocator(&local_1359);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1330);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1368);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1330);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_58.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b4,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_58.message_,
                                                             &local_1368);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_58.message_);
                                                  testing::Message::~Message(&local_1368);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1330);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_1384 = 0x132;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_13b0,"repeated_sint64"
                                                             ,&local_13b1);
                                                  pFVar3 = F(this,&local_13b0);
                                                  local_1390 = Reflection::GetRepeatedInt64
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_1380,"306",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sint64\"), 1)"
                                                  ,&local_1384,&local_1390);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_13b0);
                                                  std::allocator<char>::~allocator(&local_13b1);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1380);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_13c0);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1380);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_59.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b6,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_59.message_,
                                                             &local_13c0);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_59.message_);
                                                  testing::Message::~Message(&local_13c0);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1380);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_13e0[1] = 0x133;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1400,
                                                             "repeated_fixed32",&local_1401);
                                                  pFVar3 = F(this,&local_1400);
                                                  local_13e0[0] =
                                                       Reflection::GetRepeatedUInt32
                                                                 ((Reflection *)uVar1,message,pFVar3
                                                                  ,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_int,_nullptr>
                                                            ((EqHelper *)local_13d8,"307",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_fixed32\"), 1)"
                                                  ,(int *)(local_13e0 + 1),local_13e0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1400);
                                                  std::allocator<char>::~allocator(&local_1401);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_13d8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1410);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_13d8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_60.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b8,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_60.message_,
                                                             &local_1410);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_60.message_);
                                                  testing::Message::~Message(&local_1410);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_13d8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_142c = 0x134;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1458,
                                                             "repeated_fixed64",&local_1459);
                                                  pFVar3 = F(this,&local_1458);
                                                  local_1438 = Reflection::GetRepeatedUInt64
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_unsigned_long,_nullptr>
                                                            ((EqHelper *)local_1428,"308",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_fixed64\"), 1)"
                                                  ,&local_142c,&local_1438);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1458);
                                                  std::allocator<char>::~allocator(&local_1459);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1428);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1468);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1428);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_61.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ba,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_61.message_,
                                                             &local_1468);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_61.message_);
                                                  testing::Message::~Message(&local_1468);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1428);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_1484 = 0x135;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_14a8,
                                                             "repeated_sfixed32",&local_14a9);
                                                  pFVar3 = F(this,&local_14a8);
                                                  local_1488 = Reflection::GetRepeatedInt32
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1480,"309",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sfixed32\"), 1)"
                                                  ,&local_1484,&local_1488);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_14a8);
                                                  std::allocator<char>::~allocator(&local_14a9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1480);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_14b8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1480);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_62.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,700,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_62.message_,
                                                             &local_14b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_62.message_);
                                                  testing::Message::~Message(&local_14b8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1480);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_14d4 = 0x136;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1500,
                                                             "repeated_sfixed64",&local_1501);
                                                  pFVar3 = F(this,&local_1500);
                                                  local_14e0 = Reflection::GetRepeatedInt64
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_long,_nullptr>
                                                            ((EqHelper *)local_14d0,"310",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sfixed64\"), 1)"
                                                  ,&local_14d4,&local_14e0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1500);
                                                  std::allocator<char>::~allocator(&local_1501);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_14d0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1510);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_14d0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_63.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2be,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_63.message_,
                                                             &local_1510);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_63.message_);
                                                  testing::Message::~Message(&local_1510);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_14d0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_152c = 0x137;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1550,"repeated_float",
                                                             &local_1551);
                                                  pFVar3 = F(this,&local_1550);
                                                  local_1530 = Reflection::GetRepeatedFloat
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_float,_nullptr>
                                                            ((EqHelper *)local_1528,"311",
                                                                                                                          
                                                  "reflection->GetRepeatedFloat(message, F(\"repeated_float\"), 1)"
                                                  ,&local_152c,&local_1530);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1550);
                                                  std::allocator<char>::~allocator(&local_1551);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1528);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1560);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1528);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_64.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2bf,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_64.message_,
                                                             &local_1560);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_64.message_);
                                                  testing::Message::~Message(&local_1560);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1528);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  local_157c = 0x138;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_15a8,"repeated_double"
                                                             ,&local_15a9);
                                                  pFVar3 = F(this,&local_15a8);
                                                  local_1588 = Reflection::GetRepeatedDouble
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_double,_nullptr>
                                                            ((EqHelper *)local_1578,"312",
                                                                                                                          
                                                  "reflection->GetRepeatedDouble(message, F(\"repeated_double\"), 1)"
                                                  ,&local_157c,&local_1588);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_15a8);
                                                  std::allocator<char>::~allocator(&local_15a9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1578);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_15b8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1578);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar__1.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c1,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar__1.message_,
                                                             &local_15b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar__1.message_);
                                                  testing::Message::~Message(&local_15b8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1578);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_15f8,"repeated_bool",
                                                             &local_15f9);
                                                  pFVar3 = F(this,&local_15f8);
                                                  bVar2 = Reflection::GetRepeatedBool
                                                                    ((Reflection *)uVar1,message,
                                                                     pFVar3,1);
                                                  local_15d1 = (bool)(~bVar2 & 1);
                                                  testing::AssertionResult::AssertionResult<bool>
                                                            ((AssertionResult *)local_15d0,
                                                             &local_15d1,(type *)0x0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_15f8);
                                                  std::allocator<char>::~allocator(&local_15f9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_15d0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1608);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_65.message_,
                                                               (internal *)local_15d0,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "reflection->GetRepeatedBool(message, F(\"repeated_bool\"), 1)"
                                                  ,"true","false",in_R9);
                                                  pcVar4 = (char *)std::__cxx11::string::c_str();
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_1610,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c2,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1610,&local_1608);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1610);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_65.message_);
                                                  testing::Message::~Message(&local_1608);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_15d0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1680,"repeated_string"
                                                             ,&local_1681);
                                                  pFVar3 = F(this,&local_1680);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_1660,(Reflection *)uVar1,message
                                                             ,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1640,"\"315\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_string\"), 1)"
                                                  ,(char (*) [4])"315",&local_1660);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1660);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1680);
                                                  std::allocator<char>::~allocator(&local_1681);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1640);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1690);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1640);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_66.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c4,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_66.message_,
                                                             &local_1690);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_66.message_);
                                                  testing::Message::~Message(&local_1690);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1640);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_16e8,"repeated_bytes",
                                                             &local_16e9);
                                                  pFVar3 = F(this,&local_16e8);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_16c8,(Reflection *)uVar1,message
                                                             ,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_16a8,"\"316\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_bytes\"), 1)"
                                                  ,(char (*) [4])"316",&local_16c8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_16c8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_16e8);
                                                  std::allocator<char>::~allocator(&local_16e9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_16a8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_16f8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_16a8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_67.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c6,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_67.message_,
                                                             &local_16f8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_67.message_);
                                                  testing::Message::~Message(&local_16f8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_16a8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1730,"repeated_string"
                                                             ,&local_1731);
                                                  pFVar3 = F(this,&local_1730);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,1,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1710,"\"315\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string\"), 1, &scratch)"
                                                  ,(char (*) [4])"315",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1730);
                                                  std::allocator<char>::~allocator(&local_1731);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1710);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1740);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1710);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_68.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c9,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_68.message_,
                                                             &local_1740);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_68.message_);
                                                  testing::Message::~Message(&local_1740);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1710);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1778,"repeated_bytes",
                                                             &local_1779);
                                                  pFVar3 = F(this,&local_1778);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,1,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1758,"\"316\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_bytes\"), 1, &scratch)"
                                                  ,(char (*) [4])"316",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1778);
                                                  std::allocator<char>::~allocator(&local_1779);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1758);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1788);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1758);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1790,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2cb,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1790,&local_1788);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1790);
                                                  testing::Message::~Message(&local_1788);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1758);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_17b0,"repeatedgroup",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_69.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_17b0);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_17b0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_69.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_17cc = 0x13d;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_17d0 = Reflection::GetInt32
                                                                         (pRVar6,(Message *)
                                                                                 gtest_ar.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->repeated_group_a_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_17c8,"317",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, repeated_group_a_)"
                                                  ,&local_17cc,&local_17d0);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_17c8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_17d8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_17c8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_17e0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2cf,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_17e0,&local_17d8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_17e0);
                                                  testing::Message::~Message(&local_17d8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_17c8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1800,
                                                             "repeated_nested_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_70.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_1800);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1800);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_70.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_181c = 0x13e;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_1820 = Reflection::GetInt32
                                                                         (pRVar6,(Message *)
                                                                                 gtest_ar.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->nested_b_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1818,"318",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,&local_181c,&local_1820);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1818);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1828);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1818);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1830,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2d3,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1830,&local_1828);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1830);
                                                  testing::Message::~Message(&local_1828);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1818);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1850,
                                                             "repeated_foreign_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_71.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_1850);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1850);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_71.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_186c = 0x13f;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_1870 = Reflection::GetInt32
                                                                         (pRVar6,(Message *)
                                                                                 gtest_ar.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->foreign_c_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1868,"319",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_)"
                                                  ,&local_186c,&local_1870);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1868);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1878);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1868);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1880,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2d7,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1880,&local_1878);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1880);
                                                  testing::Message::~Message(&local_1878);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1868);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_18a0,
                                                             "repeated_import_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_72.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_18a0);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_18a0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_72.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_18bc = 0x140;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_18c0 = Reflection::GetInt32
                                                                         (pRVar6,(Message *)
                                                                                 gtest_ar.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->import_d_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_18b8,"320",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, import_d_)"
                                                  ,&local_18bc,&local_18c0);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_18b8);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_18c8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_18b8);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_18d0,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2db,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_18d0,&local_18c8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_18d0);
                                                  testing::Message::~Message(&local_18c8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_18b8);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_18f0,
                                                             "repeated_lazy_message",
                                                             (allocator<char> *)
                                                             ((long)&gtest_ar_73.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  pFVar3 = F(this,&local_18f0);
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )Reflection::GetRepeatedMessage
                                                             ((Reflection *)uVar1,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_18f0);
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             ((long)&gtest_ar_73.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  + 7));
                                                  local_190c = 0x147;
                                                  pRVar6 = Message::GetReflection
                                                                     ((Message *)
                                                                      gtest_ar.message_._M_t.
                                                                                                                                            
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl);
                                                  local_1910 = Reflection::GetInt32
                                                                         (pRVar6,(Message *)
                                                                                 gtest_ar.message_.
                                                                                 _M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl,this->nested_b_);
                                                  testing::internal::EqHelper::
                                                  Compare<int,_int,_nullptr>
                                                            ((EqHelper *)local_1908,"327",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,&local_190c,&local_1910);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1908);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1918);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1908);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_74.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2df,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_74.message_,
                                                             &local_1918);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_74.message_);
                                                  testing::Message::~Message(&local_1918);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1908);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1958,
                                                             "repeated_nested_enum",&local_1959);
                                                  pFVar3 = F(this,&local_1958);
                                                  local_1938 = Reflection::GetRepeatedEnum
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
                                                            ((EqHelper *)local_1930,"nested_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_nested_enum\"), 1)"
                                                  ,&this->nested_baz_,&local_1938);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1958);
                                                  std::allocator<char>::~allocator(&local_1959);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1930);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1968);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1930);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_75.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e2,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_75.message_,
                                                             &local_1968);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_75.message_);
                                                  testing::Message::~Message(&local_1968);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1930);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_19a8,
                                                             "repeated_foreign_enum",&local_19a9);
                                                  pFVar3 = F(this,&local_19a8);
                                                  local_1988 = Reflection::GetRepeatedEnum
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
                                                            ((EqHelper *)local_1980,"foreign_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum( message, F(\"repeated_foreign_enum\"), 1)"
                                                  ,&this->foreign_baz_,&local_1988);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_19a8);
                                                  std::allocator<char>::~allocator(&local_19a9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1980);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_19b8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1980);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_76.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e4,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_76.message_,
                                                             &local_19b8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_76.message_);
                                                  testing::Message::~Message(&local_19b8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1980);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_19f8,
                                                             "repeated_import_enum",&local_19f9);
                                                  pFVar3 = F(this,&local_19f8);
                                                  local_19d8 = Reflection::GetRepeatedEnum
                                                                         ((Reflection *)uVar1,
                                                                          message,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<const_google::protobuf::EnumValueDescriptor_*,_const_google::protobuf::EnumValueDescriptor_*,_nullptr>
                                                            ((EqHelper *)local_19d0,"import_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_import_enum\"), 1)"
                                                  ,&this->import_baz_,&local_19d8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_19f8);
                                                  std::allocator<char>::~allocator(&local_19f9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_19d0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1a08);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_19d0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_77.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e6,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_77.message_,
                                                             &local_1a08);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_77.message_);
                                                  testing::Message::~Message(&local_1a08);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_19d0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1a60,
                                                             "repeated_string_piece",&local_1a61);
                                                  pFVar3 = F(this,&local_1a60);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_1a40,(Reflection *)uVar1,message
                                                             ,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1a20,"\"324\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString( message, F(\"repeated_string_piece\"), 1)"
                                                  ,(char (*) [4])"324",&local_1a40);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a40);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1a60);
                                                  std::allocator<char>::~allocator(&local_1a61);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1a20);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1a70);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1a20);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_78.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e9,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_78.message_,
                                                             &local_1a70);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_78.message_);
                                                  testing::Message::~Message(&local_1a70);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1a20);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1aa8,
                                                             "repeated_string_piece",&local_1aa9);
                                                  pFVar3 = F(this,&local_1aa8);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,1,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1a88,"\"324\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string_piece\"), 1, &scratch)"
                                                  ,(char (*) [4])"324",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1aa8);
                                                  std::allocator<char>::~allocator(&local_1aa9);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1a88);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1ab8);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1a88);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_79.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2eb,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_79.message_,
                                                             &local_1ab8);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_79.message_);
                                                  testing::Message::~Message(&local_1ab8);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1a88);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1b10,"repeated_cord",
                                                             &local_1b11);
                                                  pFVar3 = F(this,&local_1b10);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            (&local_1af0,(Reflection *)uVar1,message
                                                             ,pFVar3,1);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1ad0,"\"325\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_cord\"), 1)"
                                                  ,(char (*) [4])"325",&local_1af0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1af0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b10);
                                                  std::allocator<char>::~allocator(&local_1b11);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1ad0);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1b20);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1ad0);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_80.message_
                                                               ,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ee,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_80.message_,
                                                             &local_1b20);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_80.message_);
                                                  testing::Message::~Message(&local_1b20);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1ad0);
                                                  uVar1 = scratch.field_2._8_8_;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_1b58,"repeated_cord",
                                                             &local_1b59);
                                                  pFVar3 = F(this,&local_1b58);
                                                  psVar5 = Reflection::GetRepeatedStringReference
                                                                     ((Reflection *)uVar1,message,
                                                                      pFVar3,1,(string *)
                                                                               &sub_message);
                                                  testing::internal::EqHelper::
                                                  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                                                            ((EqHelper *)local_1b38,"\"325\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_cord\"), 1, &scratch)"
                                                  ,(char (*) [4])"325",psVar5);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_1b58);
                                                  std::allocator<char>::~allocator(&local_1b59);
                                                  bVar2 = testing::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_1b38);
                                                  if (!bVar2) {
                                                    testing::Message::Message(&local_1b68);
                                                    pcVar4 = testing::AssertionResult::
                                                             failure_message((AssertionResult *)
                                                                             local_1b38);
                                                    testing::internal::AssertHelper::AssertHelper
                                                              (&local_1b70,kNonFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2f0,pcVar4);
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_1b70,&local_1b68);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_1b70);
                                                  testing::Message::~Message(&local_1b68);
                                                  }
                                                  testing::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_1b38);
                                                  gtest_ar_1.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl._4_4_ = 0;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&sub_message);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2(
    const Message& message) {
  const Reflection* reflection = message.GetReflection();
  std::string scratch;
  const Message* sub_message;

  // -----------------------------------------------------------------

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_int32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_int64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_uint32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_uint64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sint32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sint64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_fixed32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_fixed64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sfixed32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sfixed64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_float")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_double")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_bool")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_string")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_bytes")));

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeatedgroup")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_nested_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_foreign_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_import_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_lazy_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_nested_enum")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_foreign_enum")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_import_enum")));

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_string_piece")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_cord")));

  EXPECT_EQ(201, reflection->GetRepeatedInt32(message, F("repeated_int32"), 0));
  EXPECT_EQ(202, reflection->GetRepeatedInt64(message, F("repeated_int64"), 0));
  EXPECT_EQ(203,
            reflection->GetRepeatedUInt32(message, F("repeated_uint32"), 0));
  EXPECT_EQ(204,
            reflection->GetRepeatedUInt64(message, F("repeated_uint64"), 0));
  EXPECT_EQ(205,
            reflection->GetRepeatedInt32(message, F("repeated_sint32"), 0));
  EXPECT_EQ(206,
            reflection->GetRepeatedInt64(message, F("repeated_sint64"), 0));
  EXPECT_EQ(207,
            reflection->GetRepeatedUInt32(message, F("repeated_fixed32"), 0));
  EXPECT_EQ(208,
            reflection->GetRepeatedUInt64(message, F("repeated_fixed64"), 0));
  EXPECT_EQ(209,
            reflection->GetRepeatedInt32(message, F("repeated_sfixed32"), 0));
  EXPECT_EQ(210,
            reflection->GetRepeatedInt64(message, F("repeated_sfixed64"), 0));
  EXPECT_EQ(211, reflection->GetRepeatedFloat(message, F("repeated_float"), 0));
  EXPECT_EQ(212,
            reflection->GetRepeatedDouble(message, F("repeated_double"), 0));
  EXPECT_TRUE(reflection->GetRepeatedBool(message, F("repeated_bool"), 0));
  EXPECT_EQ("215",
            reflection->GetRepeatedString(message, F("repeated_string"), 0));
  EXPECT_EQ("216",
            reflection->GetRepeatedString(message, F("repeated_bytes"), 0));

  EXPECT_EQ("215", reflection->GetRepeatedStringReference(
                       message, F("repeated_string"), 0, &scratch));
  EXPECT_EQ("216", reflection->GetRepeatedStringReference(
                       message, F("repeated_bytes"), 0, &scratch));

  sub_message = &reflection->GetRepeatedMessage(message, F("repeatedgroup"), 0);
  EXPECT_EQ(217, sub_message->GetReflection()->GetInt32(*sub_message,
                                                        repeated_group_a_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_nested_message"), 0);
  EXPECT_EQ(218,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));
  sub_message = &reflection->GetRepeatedMessage(
      message, F("repeated_foreign_message"), 0);
  EXPECT_EQ(219,
            sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_import_message"), 0);
  EXPECT_EQ(220,
            sub_message->GetReflection()->GetInt32(*sub_message, import_d_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_lazy_message"), 0);
  EXPECT_EQ(227,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));

  EXPECT_EQ(nested_bar_,
            reflection->GetRepeatedEnum(message, F("repeated_nested_enum"), 0));
  EXPECT_EQ(foreign_bar_, reflection->GetRepeatedEnum(
                              message, F("repeated_foreign_enum"), 0));
  EXPECT_EQ(import_bar_,
            reflection->GetRepeatedEnum(message, F("repeated_import_enum"), 0));

  EXPECT_EQ("224", reflection->GetRepeatedString(
                       message, F("repeated_string_piece"), 0));
  EXPECT_EQ("224", reflection->GetRepeatedStringReference(
                       message, F("repeated_string_piece"), 0, &scratch));

  EXPECT_EQ("225",
            reflection->GetRepeatedString(message, F("repeated_cord"), 0));
  EXPECT_EQ("225", reflection->GetRepeatedStringReference(
                       message, F("repeated_cord"), 0, &scratch));

  EXPECT_EQ(301, reflection->GetRepeatedInt32(message, F("repeated_int32"), 1));
  EXPECT_EQ(302, reflection->GetRepeatedInt64(message, F("repeated_int64"), 1));
  EXPECT_EQ(303,
            reflection->GetRepeatedUInt32(message, F("repeated_uint32"), 1));
  EXPECT_EQ(304,
            reflection->GetRepeatedUInt64(message, F("repeated_uint64"), 1));
  EXPECT_EQ(305,
            reflection->GetRepeatedInt32(message, F("repeated_sint32"), 1));
  EXPECT_EQ(306,
            reflection->GetRepeatedInt64(message, F("repeated_sint64"), 1));
  EXPECT_EQ(307,
            reflection->GetRepeatedUInt32(message, F("repeated_fixed32"), 1));
  EXPECT_EQ(308,
            reflection->GetRepeatedUInt64(message, F("repeated_fixed64"), 1));
  EXPECT_EQ(309,
            reflection->GetRepeatedInt32(message, F("repeated_sfixed32"), 1));
  EXPECT_EQ(310,
            reflection->GetRepeatedInt64(message, F("repeated_sfixed64"), 1));
  EXPECT_EQ(311, reflection->GetRepeatedFloat(message, F("repeated_float"), 1));
  EXPECT_EQ(312,
            reflection->GetRepeatedDouble(message, F("repeated_double"), 1));
  EXPECT_FALSE(reflection->GetRepeatedBool(message, F("repeated_bool"), 1));
  EXPECT_EQ("315",
            reflection->GetRepeatedString(message, F("repeated_string"), 1));
  EXPECT_EQ("316",
            reflection->GetRepeatedString(message, F("repeated_bytes"), 1));

  EXPECT_EQ("315", reflection->GetRepeatedStringReference(
                       message, F("repeated_string"), 1, &scratch));
  EXPECT_EQ("316", reflection->GetRepeatedStringReference(
                       message, F("repeated_bytes"), 1, &scratch));

  sub_message = &reflection->GetRepeatedMessage(message, F("repeatedgroup"), 1);
  EXPECT_EQ(317, sub_message->GetReflection()->GetInt32(*sub_message,
                                                        repeated_group_a_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_nested_message"), 1);
  EXPECT_EQ(318,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));
  sub_message = &reflection->GetRepeatedMessage(
      message, F("repeated_foreign_message"), 1);
  EXPECT_EQ(319,
            sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_import_message"), 1);
  EXPECT_EQ(320,
            sub_message->GetReflection()->GetInt32(*sub_message, import_d_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_lazy_message"), 1);
  EXPECT_EQ(327,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));

  EXPECT_EQ(nested_baz_,
            reflection->GetRepeatedEnum(message, F("repeated_nested_enum"), 1));
  EXPECT_EQ(foreign_baz_, reflection->GetRepeatedEnum(
                              message, F("repeated_foreign_enum"), 1));
  EXPECT_EQ(import_baz_,
            reflection->GetRepeatedEnum(message, F("repeated_import_enum"), 1));

  EXPECT_EQ("324", reflection->GetRepeatedString(
                       message, F("repeated_string_piece"), 1));
  EXPECT_EQ("324", reflection->GetRepeatedStringReference(
                       message, F("repeated_string_piece"), 1, &scratch));

  EXPECT_EQ("325",
            reflection->GetRepeatedString(message, F("repeated_cord"), 1));
  EXPECT_EQ("325", reflection->GetRepeatedStringReference(
                       message, F("repeated_cord"), 1, &scratch));
}